

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_77::BinaryReaderIR::OnExport
          (BinaryReaderIR *this,Index index,ExternalKind kind,Index item_index,string_view name)

{
  Module *this_00;
  Index index_00;
  pointer pEVar1;
  unique_ptr<wabt::ExportModuleField,_std::default_delete<wabt::ExportModuleField>_> local_f8;
  Location local_f0;
  Var local_d0;
  string local_88;
  string *local_68;
  Export *export_;
  unique_ptr<wabt::ExportModuleField,_std::default_delete<wabt::ExportModuleField>_> local_40;
  unique_ptr<wabt::ExportModuleField,_std::default_delete<wabt::ExportModuleField>_> field;
  Index item_index_local;
  ExternalKind kind_local;
  Index index_local;
  BinaryReaderIR *this_local;
  string_view name_local;
  
  name_local.data_ = (char *)name.size_;
  this_local = (BinaryReaderIR *)name.data_;
  field._M_t.
  super___uniq_ptr_impl<wabt::ExportModuleField,_std::default_delete<wabt::ExportModuleField>_>._M_t
  .super__Tuple_impl<0UL,_wabt::ExportModuleField_*,_std::default_delete<wabt::ExportModuleField>_>.
  super__Head_base<0UL,_wabt::ExportModuleField_*,_false>._M_head_impl._4_4_ = item_index;
  GetLocation((Location *)&export_,this);
  MakeUnique<wabt::ExportModuleField,wabt::Location>((wabt *)&local_40,(Location *)&export_);
  pEVar1 = std::unique_ptr<wabt::ExportModuleField,_std::default_delete<wabt::ExportModuleField>_>::
           operator->(&local_40);
  local_68 = (string *)&pEVar1->export_;
  string_view::to_string_abi_cxx11_(&local_88,(string_view *)&this_local);
  std::__cxx11::string::operator=(local_68,(string *)&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  index_00 = field._M_t.
             super___uniq_ptr_impl<wabt::ExportModuleField,_std::default_delete<wabt::ExportModuleField>_>
             ._M_t.
             super__Tuple_impl<0UL,_wabt::ExportModuleField_*,_std::default_delete<wabt::ExportModuleField>_>
             .super__Head_base<0UL,_wabt::ExportModuleField_*,_false>._M_head_impl._4_4_;
  GetLocation(&local_f0,this);
  Var::Var(&local_d0,index_00,&local_f0);
  Var::operator=((Var *)(local_68 + 0x28),&local_d0);
  Var::~Var(&local_d0);
  *(ExternalKind *)(local_68 + 0x20) = kind;
  this_00 = this->module_;
  std::unique_ptr<wabt::ExportModuleField,_std::default_delete<wabt::ExportModuleField>_>::
  unique_ptr(&local_f8,&local_40);
  Module::AppendField(this_00,&local_f8);
  std::unique_ptr<wabt::ExportModuleField,_std::default_delete<wabt::ExportModuleField>_>::
  ~unique_ptr(&local_f8);
  Result::Result((Result *)((long)&name_local.size_ + 4),Ok);
  std::unique_ptr<wabt::ExportModuleField,_std::default_delete<wabt::ExportModuleField>_>::
  ~unique_ptr(&local_40);
  return (Result)name_local.size_._4_4_;
}

Assistant:

Result BinaryReaderIR::OnExport(Index index,
                                ExternalKind kind,
                                Index item_index,
                                string_view name) {
  auto field = MakeUnique<ExportModuleField>(GetLocation());
  Export& export_ = field->export_;
  export_.name = name.to_string();
  export_.var = Var(item_index, GetLocation());
  export_.kind = kind;
  module_->AppendField(std::move(field));
  return Result::Ok;
}